

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_expression.c
# Opt level: O0

AST * parse_equality_expression(Translation_Data *translation_data,Scope *scope)

{
  int iVar1;
  AST *pAVar2;
  AST_Binary_Expression *local_28;
  AST *hold;
  Scope *scope_local;
  Translation_Data *translation_data_local;
  
  local_28 = (AST_Binary_Expression *)parse_relational_expression(translation_data,scope);
  while( true ) {
    while( true ) {
      if (translation_data->tokens->size == 0) {
        return (AST *)local_28;
      }
      iVar1 = *translation_data->tokens->first->data;
      if (iVar1 != 0x31) break;
      chomp(translation_data);
      pAVar2 = parse_relational_expression(translation_data,scope);
      local_28 = get_binary_expression_tree((AST *)local_28,pAVar2,OP_EQUAL);
    }
    if (iVar1 != 0x43) break;
    chomp(translation_data);
    pAVar2 = parse_relational_expression(translation_data,scope);
    local_28 = get_binary_expression_tree((AST *)local_28,pAVar2,OP_NOT_EQUAL);
  }
  return (AST *)local_28;
}

Assistant:

struct AST* parse_equality_expression(struct Translation_Data *translation_data,struct Scope *scope)
{
	struct AST *hold;
	hold=parse_relational_expression(translation_data,scope);

	while(translation_data->tokens->size!=0)
	{
		switch(((struct token*)translation_data->tokens->first->data)->type)
		{
			case KW_EQEQ:
				chomp(translation_data);
				hold=(struct AST*)get_binary_expression_tree(hold,parse_relational_expression(translation_data,scope),OP_EQUAL);
				break;
			case KW_NOT_EQ:
				chomp(translation_data);
				hold=(struct AST*)get_binary_expression_tree(hold,parse_relational_expression(translation_data,scope),OP_NOT_EQUAL);
				break;
			default:
				return hold;
		}
	}
	return hold;
}